

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::StructUnionMemberSyntax::StructUnionMemberSyntax
          (StructUnionMemberSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token randomQualifier,
          DataTypeSyntax *type,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,
          Token semi)

{
  bool bVar1;
  reference ppAVar2;
  DataTypeSyntax *pDVar3;
  DeclaratorSyntax *pDVar4;
  size_t in_RCX;
  SyntaxNode *in_RDX;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_RDI;
  DataTypeSyntax *in_R8;
  DeclaratorSyntax *child_1;
  iterator __end2_1;
  iterator __begin2_1;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2_1;
  AttributeInstanceSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *this_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffff78;
  __normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
  local_48;
  SyntaxNode **local_40;
  DataTypeSyntax *local_38 [2];
  DataTypeSyntax *local_28;
  SyntaxNode *local_10;
  size_t local_8;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)&stack0x00000008;
  local_28 = in_R8;
  local_10 = in_RDX;
  local_8 = in_RCX;
  SyntaxNode::SyntaxNode((SyntaxNode *)in_RDI,StructUnionMember);
  SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDI,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00);
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = local_10;
  in_RDI[1].super_SyntaxListBase.childCount = local_8;
  local_38[0] = local_28;
  not_null<slang::syntax::DataTypeSyntax_*>::not_null<slang::syntax::DataTypeSyntax_*>
            ((not_null<slang::syntax::DataTypeSyntax_*> *)&in_RDI[1].elements,local_38);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::SeparatedSyntaxList(in_RDI,this_00);
  in_RDI[2].elements._M_extent._M_extent_value =
       (size_t)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[3].super_SyntaxListBase._vptr_SyntaxListBase =
       *(_func_int ***)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  (in_RDI->elements)._M_ptr = (pointer)in_RDI;
  local_40 = &(in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode;
  local_48._M_current =
       (AttributeInstanceSyntax **)
       std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)this_00)
  ;
  std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::end
            (in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
                        *)in_RDI,
                       (__normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_48);
    ((*ppAVar2)->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_48);
  }
  pDVar3 = not_null<slang::syntax::DataTypeSyntax_*>::operator->
                     ((not_null<slang::syntax::DataTypeSyntax_*> *)0xa4692e);
  (pDVar3->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)in_RDI;
  *(SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> **)
   &in_RDI[2].super_SyntaxListBase.super_SyntaxNode = in_RDI;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0xa46951);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                      ((self_type *)in_RDI,
                       (iterator_base<slang::syntax::DeclaratorSyntax_*> *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pDVar4 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                          *)0xa46990);
    (pDVar4->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

StructUnionMemberSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token randomQualifier, DataTypeSyntax& type, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        SyntaxNode(SyntaxKind::StructUnionMember), attributes(attributes), randomQualifier(randomQualifier), type(&type), declarators(declarators), semi(semi) {
        this->attributes.parent = this;
        for (auto child : this->attributes)
            child->parent = this;
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }